

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtGhostObject.cpp
# Opt level: O2

void __thiscall
cbtPairCachingGhostObject::removeOverlappingObjectInternal
          (cbtPairCachingGhostObject *this,cbtBroadphaseProxy *otherProxy,cbtDispatcher *dispatcher,
          cbtBroadphaseProxy *thisProxy1)

{
  int iVar1;
  cbtCollisionObject **ppcVar2;
  int iVar3;
  cbtBroadphaseProxy *pcVar4;
  cbtCollisionObject *otherObject;
  cbtCollisionObject *local_30;
  
  local_30 = (cbtCollisionObject *)otherProxy->m_clientObject;
  pcVar4 = (this->super_cbtGhostObject).super_cbtCollisionObject.m_broadphaseHandle;
  iVar3 = cbtAlignedObjectArray<cbtCollisionObject_*>::findLinearSearch
                    (&(this->super_cbtGhostObject).m_overlappingObjects,&local_30);
  iVar1 = (this->super_cbtGhostObject).m_overlappingObjects.m_size;
  if (iVar3 < iVar1) {
    ppcVar2 = (this->super_cbtGhostObject).m_overlappingObjects.m_data;
    if (thisProxy1 != (cbtBroadphaseProxy *)0x0) {
      pcVar4 = thisProxy1;
    }
    ppcVar2[iVar3] = ppcVar2[(long)iVar1 + -1];
    (this->super_cbtGhostObject).m_overlappingObjects.m_size = iVar1 + -1;
    (*(this->m_hashPairCache->super_cbtOverlappingPairCache).super_cbtOverlappingPairCallback.
      _vptr_cbtOverlappingPairCallback[3])(this->m_hashPairCache,pcVar4,otherProxy,dispatcher);
  }
  return;
}

Assistant:

void cbtPairCachingGhostObject::removeOverlappingObjectInternal(cbtBroadphaseProxy* otherProxy, cbtDispatcher* dispatcher, cbtBroadphaseProxy* thisProxy1)
{
	cbtCollisionObject* otherObject = (cbtCollisionObject*)otherProxy->m_clientObject;
	cbtBroadphaseProxy* actualThisProxy = thisProxy1 ? thisProxy1 : getBroadphaseHandle();
	cbtAssert(actualThisProxy);

	cbtAssert(otherObject);
	int index = m_overlappingObjects.findLinearSearch(otherObject);
	if (index < m_overlappingObjects.size())
	{
		m_overlappingObjects[index] = m_overlappingObjects[m_overlappingObjects.size() - 1];
		m_overlappingObjects.pop_back();
		m_hashPairCache->removeOverlappingPair(actualThisProxy, otherProxy, dispatcher);
	}
}